

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

string * __thiscall
absl::flags_internal::Unparse_abi_cxx11_(string *__return_storage_ptr__,flags_internal *this,long v)

{
  AlphaNum *a;
  AlphaNum local_48;
  flags_internal *local_18;
  long v_local;
  
  local_18 = this;
  v_local = (long)__return_storage_ptr__;
  AlphaNum::AlphaNum(&local_48,(long)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_48,a);
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(long v) { return absl::StrCat(v); }